

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitAig.c
# Opt level: O0

Aig_Obj_t * Kit_GraphToAig(Aig_Man_t *pMan,Aig_Obj_t **pFanins,Kit_Graph_t *pGraph)

{
  Kit_Node_t *pKVar1;
  Aig_Obj_t *pAVar2;
  int local_2c;
  int i;
  Kit_Node_t *pNode;
  Kit_Graph_t *pGraph_local;
  Aig_Obj_t **pFanins_local;
  Aig_Man_t *pMan_local;
  
  for (local_2c = 0; local_2c < pGraph->nLeaves; local_2c = local_2c + 1) {
    pKVar1 = Kit_GraphNode(pGraph,local_2c);
    pKVar1->field_2 = *(anon_union_8_2_00c7e208_for_Kit_Node_t__2 *)(pFanins + local_2c);
  }
  pAVar2 = Kit_GraphToAigInternal(pMan,pGraph);
  return pAVar2;
}

Assistant:

Aig_Obj_t * Kit_GraphToAig( Aig_Man_t * pMan, Aig_Obj_t ** pFanins, Kit_Graph_t * pGraph )
{
    Kit_Node_t * pNode = NULL;
    int i;
    // collect the fanins
    Kit_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = pFanins[i];
    // perform strashing
    return Kit_GraphToAigInternal( pMan, pGraph );
}